

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadClass.cpp
# Opt level: O2

void __thiscall sznet::detail::ThreadData::runInThread(ThreadData *this)

{
  sz_pid_t sVar1;
  undefined8 *puVar2;
  char *pcVar3;
  
  sVar1 = CurrentThread::tid();
  *this->m_tid = sVar1;
  this->m_tid = (sz_pid_t *)0x0;
  CountDownLatch::countDown(this->m_latch);
  this->m_latch = (CountDownLatch *)0x0;
  if ((this->m_name)._M_string_length == 0) {
    pcVar3 = "sznetThread";
  }
  else {
    pcVar3 = (this->m_name)._M_dataplus._M_p;
  }
  puVar2 = (undefined8 *)CurrentThread::t_threadName();
  *puVar2 = pcVar3;
  std::function<void_()>::operator()(&this->m_func);
  puVar2 = (undefined8 *)CurrentThread::t_threadName();
  *puVar2 = "finished";
  return;
}

Assistant:

void runInThread()
	{
		// 获得该线程的tid，没有缓存就重新获取再缓存
		*m_tid = sznet::CurrentThread::tid();
		m_tid = nullptr;
		// -1，唤醒
		m_latch->countDown();
		m_latch = nullptr;

		sznet::CurrentThread::t_threadName = m_name.empty() ? "sznetThread" : m_name.c_str();
		try
		{
			m_func();
			sznet::CurrentThread::t_threadName = "finished";
		}
		catch (const Exception& ex)
		{
			sznet::CurrentThread::t_threadName = "crashed";
			fprintf(stderr, "exception caught in Thread %s\n", m_name.c_str());
			fprintf(stderr, "reason: %s\n", ex.what());
			fprintf(stderr, "stack trace: %s\n", ex.stackTrace());
			abort();
		}
		catch (const std::exception& ex)
		{
			sznet::CurrentThread::t_threadName = "crashed";
			fprintf(stderr, "exception caught in Thread %s\n", m_name.c_str());
			fprintf(stderr, "reason: %s\n", ex.what());
			abort();
		}
		catch (...)
		{
			sznet::CurrentThread::t_threadName = "crashed";
			fprintf(stderr, "unknown exception caught in Thread %s\n", m_name.c_str());
			// re throw
			throw;
		}
	}